

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

uint64_t __thiscall rcg::Buffer::getPixelFormatNamespace(Buffer *this,uint32_t part)

{
  unsigned_long uVar1;
  uint32_t in_ESI;
  shared_ptr<const_rcg::GenTLWrapper> *in_RDI;
  shared_ptr<const_rcg::GenTLWrapper> *unaff_retaddr;
  undefined8 in_stack_ffffffffffffffd8;
  BUFFER_INFO_CMD cmd;
  BUFFER_PART_INFO_CMD in_stack_ffffffffffffffe8;
  shared_ptr<const_rcg::GenTLWrapper> *gentl;
  void *in_stack_fffffffffffffff8;
  
  cmd = (BUFFER_INFO_CMD)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if (((ulong)in_RDI[2].super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi & 1) == 0) {
    gentl = in_RDI;
    Stream::getHandle((Stream *)
                      (in_RDI->
                      super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
    uVar1 = anon_unknown_5::getBufferValue<unsigned_long>
                      (gentl,(void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDI,cmd);
  }
  else {
    Stream::getHandle((Stream *)
                      (in_RDI->
                      super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
    uVar1 = anon_unknown_5::getBufferPartValue<unsigned_long>
                      (unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,in_ESI,
                       in_stack_ffffffffffffffe8);
  }
  return uVar1;
}

Assistant:

uint64_t Buffer::getPixelFormatNamespace(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<uint64_t>(gentl, parent->getHandle(), buffer, part,
                                        GenTL::BUFFER_PART_INFO_DATA_FORMAT_NAMESPACE);
  }
  else
  {
    return getBufferValue<uint64_t>(gentl, parent->getHandle(), buffer,
                                    GenTL::BUFFER_INFO_PIXELFORMAT_NAMESPACE);
  }
}